

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *__dest;
  char **ppcVar6;
  int iVar7;
  char **ppcVar8;
  ulong uVar9;
  long lVar10;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar9 = (ulong)(uint)(this->History).Size;
  do {
    iVar2 = (this->History).Size;
    if ((int)uVar9 < 1) goto LAB_00181af7;
    if (iVar2 < (int)uVar9) goto LAB_00181cd9;
    iVar2 = Stricmp((this->History).Data[uVar9 - 1],command_line);
    uVar9 = uVar9 - 1;
  } while (iVar2 != 0);
  iVar2 = (int)uVar9 + 1;
  if ((this->History).Size < iVar2) {
LAB_00181cd9:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                  ,0x38b,"value_type &ImVector<char *>::operator[](int) [T = char *]");
  }
  free((this->History).Data[uVar9]);
  uVar1 = (this->History).Size;
  if ((int)uVar1 < iVar2) {
    __assert_fail("it >= Data && it < Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                  ,0x3aa,"iterator ImVector<char *>::erase(const_iterator) [T = char *]");
  }
  ppcVar6 = (this->History).Data;
  uVar9 = uVar9 & 0xffffffff;
  memmove(ppcVar6 + uVar9,ppcVar6 + uVar9 + 1,((ulong)uVar1 + ~uVar9) * 8);
  iVar2 = (this->History).Size + -1;
  (this->History).Size = iVar2;
LAB_00181af7:
  sVar5 = strlen(command_line);
  __dest = (char *)malloc(sVar5 + 1);
  memcpy(__dest,command_line,sVar5 + 1);
  if (iVar2 == (this->History).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar7 = iVar3;
    }
    ppcVar6 = (char **)ImGui::MemAlloc((long)iVar7 << 3);
    ppcVar8 = (this->History).Data;
    if (ppcVar8 == (char **)0x0) {
      ppcVar8 = (char **)0x0;
    }
    else {
      memcpy(ppcVar6,ppcVar8,(long)(this->History).Size << 3);
      ppcVar8 = (this->History).Data;
    }
    ImGui::MemFree(ppcVar8);
    (this->History).Data = ppcVar6;
    (this->History).Capacity = iVar7;
    iVar2 = (this->History).Size;
  }
  else {
    ppcVar6 = (this->History).Data;
  }
  (this->History).Size = iVar2 + 1;
  ppcVar6[iVar2] = __dest;
  iVar2 = Stricmp(command_line,"CLEAR");
  if (iVar2 == 0) {
    ClearLog(this);
    return;
  }
  iVar2 = Stricmp(command_line,"HELP");
  if (iVar2 == 0) {
    AddLog(this,"Commands:");
    if (0 < (this->Commands).Size) {
      lVar10 = 0;
      do {
        AddLog(this,"- %s",(this->Commands).Data[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->Commands).Size);
    }
  }
  else {
    iVar2 = Stricmp(command_line,"HISTORY");
    if (iVar2 != 0) {
      AddLog(this,"Unknown command: \'%s\'\n",command_line);
      return;
    }
    uVar1 = (this->History).Size;
    uVar4 = 10;
    if (10 < (int)uVar1) {
      uVar4 = uVar1;
    }
    if ((int)(uVar4 - 10) < (int)uVar1) {
      uVar9 = (ulong)uVar4 - 10;
      do {
        AddLog(this,"%3d: %s\n",uVar9 & 0xffffffff,(this->History).Data[uVar9]);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)(this->History).Size);
    }
  }
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back. This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size-1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }
    }